

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::StringPtr,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:138:46),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::StringPtr,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:138:46),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::StringPtr> *pEVar1;
  int *in_00;
  ArrayPtr<const_char> local_5f8;
  ExceptionOr<kj::StringPtr> local_5e8;
  int *local_470;
  int *depValue;
  ExceptionOr<kj::StringPtr> local_310;
  Exception *local_198;
  Exception *depException;
  undefined1 local_180 [8];
  ExceptionOr<int> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::StringPtr,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:138:46),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr = (NullableValue<int>)output;
  ExceptionOr<int>::ExceptionOr((ExceptionOr<int> *)local_180);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_180);
  local_198 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
  if (local_198 == (Exception *)0x0) {
    local_470 = readMaybe<int>((Maybe<int> *)
                               ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 +
                               0x150));
    if (local_470 != (int *)0x0) {
      in_00 = mv<int>(local_470);
      local_5f8 = (ArrayPtr<const_char>)
                  MaybeVoidCaller<int,kj::StringPtr>::
                  apply<kj::(anonymous_namespace)::TestCase130::run()::__1>
                            ((Type *)&this->field_0x20,in_00);
      handle(&local_5e8,this,(StringPtr *)&local_5f8);
      pEVar1 = ExceptionOrValue::as<kj::StringPtr>((ExceptionOrValue *)depResult.value.ptr);
      ExceptionOr<kj::StringPtr>::operator=(pEVar1,&local_5e8);
      ExceptionOr<kj::StringPtr>::~ExceptionOr(&local_5e8);
    }
  }
  else {
    in = mv<kj::Exception>(local_198);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x21,in)
    ;
    handle(&local_310,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::StringPtr>((ExceptionOrValue *)depResult.value.ptr);
    ExceptionOr<kj::StringPtr>::operator=(pEVar1,&local_310);
    ExceptionOr<kj::StringPtr>::~ExceptionOr(&local_310);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<int>::~ExceptionOr((ExceptionOr<int> *)local_180);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }